

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionBody::UpdateActiveFunctionsForOneDataSet
          (FunctionBody *this,ActiveFunctionSet *pActiveFuncs,FunctionCodeGenRuntimeData *parentData
          ,Type *dataSet,uint count)

{
  FunctionCodeGenRuntimeData **ppFVar1;
  FunctionBody *this_00;
  uint local_3c;
  FunctionCodeGenRuntimeData *pFStack_38;
  uint i;
  FunctionCodeGenRuntimeData *inlineeData;
  uint count_local;
  Type *dataSet_local;
  FunctionCodeGenRuntimeData *parentData_local;
  ActiveFunctionSet *pActiveFuncs_local;
  FunctionBody *this_local;
  
  for (local_3c = 0; local_3c < count; local_3c = local_3c + 1) {
    ppFVar1 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenRuntimeData__
                        ((WriteBarrierPtr *)(dataSet + local_3c));
    for (pFStack_38 = *ppFVar1; pFStack_38 != (FunctionCodeGenRuntimeData *)0x0;
        pFStack_38 = FunctionCodeGenRuntimeData::GetNext(pFStack_38)) {
      if (pFStack_38 != parentData) {
        this_00 = FunctionCodeGenRuntimeData::GetFunctionBody(pFStack_38);
        UpdateActiveFunctionSet(this_00,pActiveFuncs,pFStack_38);
      }
    }
  }
  return;
}

Assistant:

void FunctionBody::UpdateActiveFunctionsForOneDataSet(ActiveFunctionSet *pActiveFuncs, FunctionCodeGenRuntimeData *parentData, Field(FunctionCodeGenRuntimeData*)* dataSet, uint count) const
    {
        FunctionCodeGenRuntimeData *inlineeData;
        for (uint i = 0; i < count; i++)
        {
            for (inlineeData = dataSet[i]; inlineeData; inlineeData = inlineeData->GetNext())
            {
                // inlineeData == parentData indicates a cycle in the structure. We've already processed parentData, so don't descend.
                if (inlineeData != parentData)
                {
                    inlineeData->GetFunctionBody()->UpdateActiveFunctionSet(pActiveFuncs, inlineeData);
                }
            }
        }
    }